

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_queue.cpp
# Opt level: O1

void mpmc_basics<int,4ul>(void)

{
  code *pcVar1;
  double dVar2;
  char extraout_AL;
  bool bVar3;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  char extraout_AL_05;
  char extraout_AL_06;
  char extraout_AL_07;
  char extraout_AL_08;
  char extraout_AL_09;
  char extraout_AL_10;
  char extraout_AL_11;
  char extraout_AL_12;
  atomic<unsigned_long> *paVar4;
  __atomic_base<unsigned_long> _Var5;
  __atomic_base<unsigned_long> _Var6;
  __int_type_conflict1 _Var7;
  ulong uVar8;
  ulong uVar9;
  int *piVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Da_22;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Da_23;
  undefined4 extraout_XMM0_Da_24;
  undefined4 extraout_XMM0_Da_25;
  undefined4 extraout_XMM0_Da_26;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Db_22;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Db_24;
  undefined4 extraout_XMM0_Db_25;
  undefined4 extraout_XMM0_Db_26;
  ResultBuilder DOCTEST_RB;
  size_t N;
  MPMC<int,_4UL> mpmc;
  bool local_3c1;
  Result local_3c0;
  ResultBuilder local_3a0;
  Expression_lhs<const_unsigned_long> local_328;
  int *local_318;
  unsigned_long local_310 [2];
  MPMC<int,_4UL> local_300;
  
  paVar4 = &local_300._buffer._M_elems[0].sequence;
  _Var7 = 0;
  do {
    (paVar4->super___atomic_base<unsigned_long>)._M_i = _Var7;
    _Var7 = _Var7 + 1;
    paVar4 = paVar4 + 2;
  } while (_Var7 != 0x10);
  local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_300._dequeue_pos.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_310[0] = 0x10;
  local_318 = (int *)operator_new(0x44);
  *local_318 = -1;
  local_318[1] = -1;
  local_318[2] = -1;
  local_318[3] = -1;
  local_318[4] = -1;
  local_318[5] = -1;
  local_318[6] = -1;
  local_318[7] = -1;
  local_318[8] = -1;
  local_318[9] = -1;
  local_318[10] = -1;
  local_318[0xb] = -1;
  local_318[0xc] = -1;
  local_318[0xd] = -1;
  local_318[0xe] = -1;
  local_318[0xf] = -1;
  local_318[0x10] = -1;
  local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a0.super_AssertData.m_at = DT_REQUIRE;
  local_3a0.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a0.super_AssertData.m_line = 0x186;
  local_3a0.super_AssertData.m_expr = "mpmc.capacity() == N";
  local_3a0.super_AssertData.m_failed = true;
  local_3a0.super_AssertData.m_threw = false;
  local_3a0.super_AssertData.m_threw_as = false;
  local_3a0.super_AssertData.m_exception_type = "";
  local_3a0.super_AssertData.m_exception_string = "";
  local_328.lhs = 0x10;
  local_328.m_at = DT_REQUIRE;
  doctest::detail::Expression_lhs<const_unsigned_long>::operator==<unsigned_long,_nullptr>
            (&local_3c0,&local_328,local_310);
  doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
  local_3a0.super_AssertData._40_2_ =
       CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
  uVar11 = extraout_XMM0_Da;
  uVar12 = extraout_XMM0_Db;
  if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
    uVar11 = extraout_XMM0_Da_00;
    uVar12 = extraout_XMM0_Db_00;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar12,uVar11));
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a0.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                       local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a0.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a0.super_AssertData.m_at = DT_REQUIRE;
  local_3a0.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a0.super_AssertData.m_line = 0x188;
  local_3a0.super_AssertData.m_expr = "mpmc.empty() == true";
  local_3a0.super_AssertData.m_failed = true;
  local_3a0.super_AssertData.m_threw = false;
  local_3a0.super_AssertData.m_threw_as = false;
  local_3a0.super_AssertData.m_exception_type = "";
  local_3a0.super_AssertData.m_exception_string = "";
  local_328.lhs =
       0xc00000001 -
       (ulong)((ulong)local_300._dequeue_pos.super___atomic_base<unsigned_long>._M_i <
              (ulong)local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i);
  local_3c1 = true;
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3c0,(Expression_lhs<bool_const> *)&local_328,&local_3c1);
  doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
  local_3a0.super_AssertData._40_2_ =
       CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
  uVar11 = extraout_XMM0_Da_01;
  uVar12 = extraout_XMM0_Db_01;
  if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
    uVar11 = extraout_XMM0_Da_02;
    uVar12 = extraout_XMM0_Db_02;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar12,uVar11));
  if (extraout_AL_00 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a0.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                       local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a0.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a0.super_AssertData.m_at = DT_REQUIRE;
  local_3a0.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a0.super_AssertData.m_line = 0x189;
  local_3a0.super_AssertData.m_expr = "mpmc.try_dequeue() == std::nullopt";
  local_3a0.super_AssertData.m_failed = true;
  local_3a0.super_AssertData.m_threw = false;
  local_3a0.super_AssertData.m_threw_as = false;
  local_3a0.super_AssertData.m_exception_type = "";
  local_3a0.super_AssertData.m_exception_string = "";
  local_328.lhs = (unsigned_long)tf::MPMC<int,_4UL>::try_dequeue(&local_300);
  local_328.m_at = DT_REQUIRE;
  doctest::detail::Expression_lhs<const_std::optional<int>_>::operator==<std::nullopt_t,_nullptr>
            (&local_3c0,(Expression_lhs<const_std::optional<int>_> *)&local_328,
             (nullopt_t *)&std::nullopt);
  doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
  local_3a0.super_AssertData._40_2_ =
       CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
  uVar11 = extraout_XMM0_Da_03;
  uVar12 = extraout_XMM0_Db_03;
  if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
    uVar11 = extraout_XMM0_Da_04;
    uVar12 = extraout_XMM0_Db_04;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar12,uVar11));
  if (extraout_AL_01 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a0.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                       local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a0.super_AssertData.m_exception.field_0.buf[0]));
  }
  if (local_310[0] != 0) {
    uVar9 = 0;
    do {
      local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_3a0.super_AssertData.m_at = DT_REQUIRE;
      local_3a0.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
      ;
      local_3a0.super_AssertData.m_line = 0x18c;
      local_3a0.super_AssertData.m_expr = "mpmc.try_enqueue(data[i]) == true";
      local_3a0.super_AssertData.m_failed = true;
      local_3a0.super_AssertData.m_threw = false;
      local_3a0.super_AssertData.m_threw_as = false;
      local_3a0.super_AssertData.m_exception_type = "";
      local_3a0.super_AssertData.m_exception_string = "";
      bVar3 = tf::MPMC<int,_4UL>::try_enqueue(&local_300,local_318[uVar9]);
      local_328.lhs = (ulong)bVar3 | 0xc00000000;
      local_3c1 = true;
      doctest::detail::Expression_lhs<bool_const>::operator==
                (&local_3c0,(Expression_lhs<bool_const> *)&local_328,&local_3c1);
      doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
      local_3a0.super_AssertData._40_2_ =
           CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
      uVar11 = extraout_XMM0_Da_05;
      uVar12 = extraout_XMM0_Db_05;
      if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
        uVar11 = extraout_XMM0_Da_06;
        uVar12 = extraout_XMM0_Db_06;
      }
      dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar12,uVar11));
      if (extraout_AL_02 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      if ((local_3a0.super_AssertData.m_failed == true) &&
         (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
        doctest::detail::throwException();
      }
      if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                           local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                           local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                           local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                           local_3a0.super_AssertData.m_exception.field_0.buf[0]));
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < local_310[0]);
  }
  local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a0.super_AssertData.m_at = DT_REQUIRE;
  local_3a0.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a0.super_AssertData.m_line = 399;
  local_3a0.super_AssertData.m_expr = "mpmc.try_enqueue(data[N]) == false";
  local_3a0.super_AssertData.m_failed = true;
  local_3a0.super_AssertData.m_threw = false;
  local_3a0.super_AssertData.m_threw_as = false;
  local_3a0.super_AssertData.m_exception_type = "";
  local_3a0.super_AssertData.m_exception_string = "";
  bVar3 = tf::MPMC<int,_4UL>::try_enqueue(&local_300,local_318[local_310[0]]);
  local_328.lhs = (ulong)bVar3 | 0xc00000000;
  local_3c1 = false;
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3c0,(Expression_lhs<bool_const> *)&local_328,&local_3c1);
  doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
  local_3a0.super_AssertData._40_2_ =
       CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
  uVar11 = extraout_XMM0_Da_07;
  uVar12 = extraout_XMM0_Db_07;
  if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
    uVar11 = extraout_XMM0_Da_08;
    uVar12 = extraout_XMM0_Db_08;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar12,uVar11));
  if (extraout_AL_03 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a0.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                       local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a0.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a0.super_AssertData.m_at = DT_REQUIRE;
  local_3a0.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a0.super_AssertData.m_line = 400;
  local_3a0.super_AssertData.m_expr = "mpmc.empty() == false";
  local_3a0.super_AssertData.m_failed = true;
  local_3a0.super_AssertData.m_threw = false;
  local_3a0.super_AssertData.m_threw_as = false;
  local_3a0.super_AssertData.m_exception_type = "";
  local_3a0.super_AssertData.m_exception_string = "";
  local_328.lhs =
       (ulong)((ulong)local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i <=
              (ulong)local_300._dequeue_pos.super___atomic_base<unsigned_long>._M_i) | 0xc00000000;
  local_3c1 = false;
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3c0,(Expression_lhs<bool_const> *)&local_328,&local_3c1);
  doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
  local_3a0.super_AssertData._40_2_ =
       CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
  uVar11 = extraout_XMM0_Da_09;
  uVar12 = extraout_XMM0_Db_09;
  if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
    uVar11 = extraout_XMM0_Da_10;
    uVar12 = extraout_XMM0_Db_10;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar12,uVar11));
  if (extraout_AL_04 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a0.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                       local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a0.super_AssertData.m_exception.field_0.buf[0]));
  }
  if (local_310[0] != 0) {
    uVar9 = 0;
    piVar10 = local_318;
    do {
      local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_3a0.super_AssertData.m_at = DT_REQUIRE;
      local_3a0.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
      ;
      local_3a0.super_AssertData.m_line = 0x193;
      local_3a0.super_AssertData.m_expr = "mpmc.try_dequeue() == data[i]";
      local_3a0.super_AssertData.m_failed = true;
      local_3a0.super_AssertData.m_threw = false;
      local_3a0.super_AssertData.m_threw_as = false;
      local_3a0.super_AssertData.m_exception_type = "";
      local_3a0.super_AssertData.m_exception_string = "";
      local_328.lhs = (unsigned_long)tf::MPMC<int,_4UL>::try_dequeue(&local_300);
      local_328.m_at = DT_REQUIRE;
      doctest::detail::Expression_lhs<const_std::optional<int>_>::operator==<int,_nullptr>
                (&local_3c0,(Expression_lhs<const_std::optional<int>_> *)&local_328,piVar10);
      doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
      local_3a0.super_AssertData._40_2_ =
           CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
      uVar11 = extraout_XMM0_Da_11;
      uVar12 = extraout_XMM0_Db_11;
      if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
        uVar11 = extraout_XMM0_Da_12;
        uVar12 = extraout_XMM0_Db_12;
      }
      dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar12,uVar11));
      if (extraout_AL_05 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      if ((local_3a0.super_AssertData.m_failed == true) &&
         (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
        doctest::detail::throwException();
      }
      if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                           local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                           local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                           local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                           local_3a0.super_AssertData.m_exception.field_0.buf[0]));
      }
      uVar9 = uVar9 + 1;
      piVar10 = piVar10 + 1;
    } while (uVar9 < local_310[0]);
  }
  local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a0.super_AssertData.m_at = DT_REQUIRE;
  local_3a0.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a0.super_AssertData.m_line = 0x196;
  local_3a0.super_AssertData.m_expr = "mpmc.empty() == true";
  local_3a0.super_AssertData.m_failed = true;
  local_3a0.super_AssertData.m_threw = false;
  local_3a0.super_AssertData.m_threw_as = false;
  local_3a0.super_AssertData.m_exception_type = "";
  local_3a0.super_AssertData.m_exception_string = "";
  local_328.lhs =
       (ulong)((ulong)local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i <=
              (ulong)local_300._dequeue_pos.super___atomic_base<unsigned_long>._M_i) | 0xc00000000;
  local_3c1 = true;
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3c0,(Expression_lhs<bool_const> *)&local_328,&local_3c1);
  doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
  local_3a0.super_AssertData._40_2_ =
       CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
  uVar11 = extraout_XMM0_Da_13;
  uVar12 = extraout_XMM0_Db_13;
  if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
    uVar11 = extraout_XMM0_Da_14;
    uVar12 = extraout_XMM0_Db_14;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar12,uVar11));
  if (extraout_AL_06 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a0.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                       local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a0.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a0.super_AssertData.m_at = DT_REQUIRE;
  local_3a0.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a0.super_AssertData.m_line = 0x197;
  local_3a0.super_AssertData.m_expr = "mpmc.try_dequeue() == std::nullopt";
  local_3a0.super_AssertData.m_failed = true;
  local_3a0.super_AssertData.m_threw = false;
  local_3a0.super_AssertData.m_threw_as = false;
  local_3a0.super_AssertData.m_exception_type = "";
  local_3a0.super_AssertData.m_exception_string = "";
  local_328.lhs = (unsigned_long)tf::MPMC<int,_4UL>::try_dequeue(&local_300);
  local_328.m_at = DT_REQUIRE;
  doctest::detail::Expression_lhs<const_std::optional<int>_>::operator==<std::nullopt_t,_nullptr>
            (&local_3c0,(Expression_lhs<const_std::optional<int>_> *)&local_328,
             (nullopt_t *)&std::nullopt);
  doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
  local_3a0.super_AssertData._40_2_ =
       CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
  uVar11 = extraout_XMM0_Da_15;
  uVar12 = extraout_XMM0_Db_15;
  if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
    uVar11 = extraout_XMM0_Da_16;
    uVar12 = extraout_XMM0_Db_16;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar12,uVar11));
  if (extraout_AL_07 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a0.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                       local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a0.super_AssertData.m_exception.field_0.buf[0]));
  }
  if (local_310[0] != 0) {
    uVar9 = 0;
    do {
      _Var6 = local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i;
      do {
        uVar8 = (ulong)(((uint)_Var6._M_i & 0xf) << 4);
        if (*(ulong *)((long)&local_300._buffer._M_elems[0].sequence.
                              super___atomic_base<unsigned_long>._M_i + uVar8) == _Var6._M_i) {
          LOCK();
          bVar3 = (__atomic_base<unsigned_long>)_Var6._M_i ==
                  local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i;
          _Var5 = local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i;
          if (bVar3) {
            local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)(_Var6._M_i + 1);
            _Var5._M_i = _Var6._M_i;
          }
          UNLOCK();
          bVar3 = !bVar3;
          _Var6._M_i = _Var5._M_i;
        }
        else {
          bVar3 = true;
          _Var6 = local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i;
        }
      } while (bVar3);
      *(int *)((long)&local_300._buffer._M_elems[0].data + uVar8) = local_318[uVar9];
      *(__int_type_conflict1 *)
       ((long)&local_300._buffer._M_elems[0].sequence.super___atomic_base<unsigned_long>._M_i +
       uVar8) = _Var6._M_i + 1;
      uVar9 = uVar9 + 1;
    } while (uVar9 < local_310[0]);
  }
  local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a0.super_AssertData.m_at = DT_REQUIRE;
  local_3a0.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a0.super_AssertData.m_line = 0x19c;
  local_3a0.super_AssertData.m_expr = "mpmc.try_enqueue(data[N]) == false";
  local_3a0.super_AssertData.m_failed = true;
  local_3a0.super_AssertData.m_threw = false;
  local_3a0.super_AssertData.m_threw_as = false;
  local_3a0.super_AssertData.m_exception_type = "";
  local_3a0.super_AssertData.m_exception_string = "";
  bVar3 = tf::MPMC<int,_4UL>::try_enqueue(&local_300,local_318[local_310[0]]);
  local_328.lhs = (ulong)bVar3 | 0xc00000000;
  local_3c1 = false;
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3c0,(Expression_lhs<bool_const> *)&local_328,&local_3c1);
  doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
  local_3a0.super_AssertData._40_2_ =
       CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
  uVar11 = extraout_XMM0_Da_17;
  uVar12 = extraout_XMM0_Db_17;
  if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
    uVar11 = extraout_XMM0_Da_18;
    uVar12 = extraout_XMM0_Db_18;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar12,uVar11));
  if (extraout_AL_08 == '\0') {
    if ((local_3a0.super_AssertData.m_failed == true) &&
       (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
      doctest::detail::throwException();
    }
    if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                         local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                         local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                         local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                         local_3a0.super_AssertData.m_exception.field_0.buf[0]));
    }
    if (local_310[0] != 0) {
      uVar9 = 0;
      piVar10 = local_318;
      do {
        local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
        local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
        local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
        local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
        local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
        local_3a0.super_AssertData.m_at = DT_REQUIRE;
        local_3a0.super_AssertData.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
        ;
        local_3a0.super_AssertData.m_line = 0x19f;
        local_3a0.super_AssertData.m_expr = "mpmc.empty() == false";
        local_3a0.super_AssertData.m_failed = true;
        local_3a0.super_AssertData.m_threw = false;
        local_3a0.super_AssertData.m_threw_as = false;
        local_3a0.super_AssertData.m_exception_type = "";
        local_3a0.super_AssertData.m_exception_string = "";
        local_328.lhs =
             (ulong)((ulong)local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i <=
                    (ulong)local_300._dequeue_pos.super___atomic_base<unsigned_long>._M_i) |
             0xc00000000;
        local_3c1 = false;
        doctest::detail::Expression_lhs<bool_const>::operator==
                  (&local_3c0,(Expression_lhs<bool_const> *)&local_328,&local_3c1);
        doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
        local_3a0.super_AssertData._40_2_ =
             CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
        uVar11 = extraout_XMM0_Da_19;
        uVar12 = extraout_XMM0_Db_19;
        if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
           (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
          operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
          uVar11 = extraout_XMM0_Da_20;
          uVar12 = extraout_XMM0_Db_20;
        }
        dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar12,uVar11));
        if (extraout_AL_09 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        if ((local_3a0.super_AssertData.m_failed == true) &&
           (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
          doctest::detail::throwException();
        }
        if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                             local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
          operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                             local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
        }
        if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                             local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0))
        {
          operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                             local_3a0.super_AssertData.m_exception.field_0.buf[0]))
          ;
        }
        local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
        local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
        local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
        local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
        local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
        local_3a0.super_AssertData.m_at = DT_REQUIRE;
        local_3a0.super_AssertData.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
        ;
        local_3a0.super_AssertData.m_line = 0x1a0;
        local_3a0.super_AssertData.m_expr = "mpmc.try_dequeue() == data[i]";
        local_3a0.super_AssertData.m_failed = true;
        local_3a0.super_AssertData.m_threw = false;
        local_3a0.super_AssertData.m_threw_as = false;
        local_3a0.super_AssertData.m_exception_type = "";
        local_3a0.super_AssertData.m_exception_string = "";
        local_328.lhs = (unsigned_long)tf::MPMC<int,_4UL>::try_dequeue(&local_300);
        local_328.m_at = DT_REQUIRE;
        doctest::detail::Expression_lhs<const_std::optional<int>_>::operator==<int,_nullptr>
                  (&local_3c0,(Expression_lhs<const_std::optional<int>_> *)&local_328,piVar10);
        doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
        local_3a0.super_AssertData._40_2_ =
             CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
        uVar11 = extraout_XMM0_Da_21;
        uVar12 = extraout_XMM0_Db_21;
        if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
           (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
          operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
          uVar11 = extraout_XMM0_Da_22;
          uVar12 = extraout_XMM0_Db_22;
        }
        dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar12,uVar11));
        if (extraout_AL_10 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        if ((local_3a0.super_AssertData.m_failed == true) &&
           (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
          doctest::detail::throwException();
        }
        if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                             local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
          operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                             local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
        }
        if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
           ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                             local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0))
        {
          operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                             local_3a0.super_AssertData.m_exception.field_0.buf[0]))
          ;
        }
        uVar9 = uVar9 + 1;
        piVar10 = piVar10 + 1;
      } while (uVar9 < local_310[0]);
    }
    local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_3a0.super_AssertData.m_at = DT_REQUIRE;
    local_3a0.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
    ;
    local_3a0.super_AssertData.m_line = 0x1a3;
    local_3a0.super_AssertData.m_expr = "mpmc.empty() == true";
    local_3a0.super_AssertData.m_failed = true;
    local_3a0.super_AssertData.m_threw = false;
    local_3a0.super_AssertData.m_threw_as = false;
    local_3a0.super_AssertData.m_exception_type = "";
    local_3a0.super_AssertData.m_exception_string = "";
    local_328.lhs =
         (ulong)((ulong)local_300._enqueue_pos.super___atomic_base<unsigned_long>._M_i <=
                (ulong)local_300._dequeue_pos.super___atomic_base<unsigned_long>._M_i) | 0xc00000000
    ;
    local_3c1 = true;
    doctest::detail::Expression_lhs<bool_const>::operator==
              (&local_3c0,(Expression_lhs<bool_const> *)&local_328,&local_3c1);
    doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
    local_3a0.super_AssertData._40_2_ =
         CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
    uVar11 = extraout_XMM0_Da_23;
    uVar12 = extraout_XMM0_Db_23;
    if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
      uVar11 = extraout_XMM0_Da_24;
      uVar12 = extraout_XMM0_Db_24;
    }
    dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar12,uVar11));
    if (extraout_AL_11 != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)(SUB84(dVar2,0));
      return;
    }
    if ((local_3a0.super_AssertData.m_failed == true) &&
       (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
      doctest::detail::throwException();
    }
    if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                         local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                         local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                         local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                         local_3a0.super_AssertData.m_exception.field_0.buf[0]));
    }
    local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_3a0.super_AssertData.m_at = DT_REQUIRE;
    local_3a0.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
    ;
    local_3a0.super_AssertData.m_line = 0x1a4;
    local_3a0.super_AssertData.m_expr = "mpmc.try_dequeue() == std::nullopt";
    local_3a0.super_AssertData.m_failed = true;
    local_3a0.super_AssertData.m_threw = false;
    local_3a0.super_AssertData.m_threw_as = false;
    local_3a0.super_AssertData.m_exception_type = "";
    local_3a0.super_AssertData.m_exception_string = "";
    local_328.lhs = (unsigned_long)tf::MPMC<int,_4UL>::try_dequeue(&local_300);
    local_328.m_at = DT_REQUIRE;
    doctest::detail::Expression_lhs<const_std::optional<int>_>::operator==<std::nullopt_t,_nullptr>
              (&local_3c0,(Expression_lhs<const_std::optional<int>_> *)&local_328,
               (nullopt_t *)&std::nullopt);
    doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
    local_3a0.super_AssertData._40_2_ =
         CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
    uVar11 = extraout_XMM0_Da_25;
    uVar12 = extraout_XMM0_Db_25;
    if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
      uVar11 = extraout_XMM0_Da_26;
      uVar12 = extraout_XMM0_Db_26;
    }
    dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar12,uVar11));
    if (extraout_AL_12 == '\0') {
      if ((local_3a0.super_AssertData.m_failed == true) &&
         (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
        doctest::detail::throwException();
      }
      if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                           local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                           local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                           local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                           local_3a0.super_AssertData.m_exception.field_0.buf[0]));
      }
      operator_delete(local_318,0x44);
      return;
    }
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)(SUB84(dVar2,0));
  return;
}

Assistant:

void mpmc_basics() {

  tf::MPMC<T, LogSize> mpmc;
  size_t N = (1<<LogSize);
  std::vector<T> data(N+1, -1);

  REQUIRE(mpmc.capacity() == N);

  REQUIRE(mpmc.empty() == true);
  REQUIRE(mpmc.try_dequeue() == std::nullopt);

  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.try_enqueue(data[i]) == true);
  }

  REQUIRE(mpmc.try_enqueue(data[N]) == false);
  REQUIRE(mpmc.empty() == false);

  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.try_dequeue() == data[i]);
  }

  REQUIRE(mpmc.empty() == true); 
  REQUIRE(mpmc.try_dequeue() == std::nullopt);

  for(size_t i=0; i<N; i++) {
    mpmc.enqueue(data[i]);
  }
  REQUIRE(mpmc.try_enqueue(data[N]) == false);
  
  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.empty() == false);
    REQUIRE(mpmc.try_dequeue() == data[i]);
  }

  REQUIRE(mpmc.empty() == true); 
  REQUIRE(mpmc.try_dequeue() == std::nullopt);
}